

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

void anon_unknown.dwarf_1412e7::allocatePixels
               (int type,Array2D<unsigned_int> *sampleCount,Array2D<unsigned_int_*> *uintData,
               Array2D<float_*> *floatData,Array2D<half_*> *halfData,int x1,int x2,int y1,int y2)

{
  uint *puVar1;
  ulong uVar2;
  uint **ppuVar3;
  float *pfVar4;
  float **ppfVar5;
  half *phVar6;
  half **pphVar7;
  Array2D<float_*> *in_RCX;
  Array2D<unsigned_int_*> *in_RDX;
  Array2D<unsigned_int> *in_RSI;
  int in_EDI;
  Array2D<half_*> *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int x;
  int y;
  int local_34;
  int local_30;
  
  for (local_30 = in_stack_00000010; local_34 = in_R9D, local_30 <= in_stack_00000018;
      local_30 = local_30 + 1) {
    for (; local_34 <= in_stack_00000008; local_34 = local_34 + 1) {
      if (in_EDI == 0) {
        puVar1 = Imf_2_5::Array2D<unsigned_int>::operator[](in_RSI,(long)local_30);
        uVar2 = SUB168(ZEXT416(puVar1[local_34]) * ZEXT816(4),0);
        if (SUB168(ZEXT416(puVar1[local_34]) * ZEXT816(4),8) != 0) {
          uVar2 = 0xffffffffffffffff;
        }
        puVar1 = (uint *)operator_new__(uVar2);
        ppuVar3 = Imf_2_5::Array2D<unsigned_int_*>::operator[](in_RDX,(long)local_30);
        ppuVar3[local_34] = puVar1;
      }
      if (in_EDI == 1) {
        puVar1 = Imf_2_5::Array2D<unsigned_int>::operator[](in_RSI,(long)local_30);
        uVar2 = SUB168(ZEXT416(puVar1[local_34]) * ZEXT816(4),0);
        if (SUB168(ZEXT416(puVar1[local_34]) * ZEXT816(4),8) != 0) {
          uVar2 = 0xffffffffffffffff;
        }
        pfVar4 = (float *)operator_new__(uVar2);
        ppfVar5 = Imf_2_5::Array2D<float_*>::operator[](in_RCX,(long)local_30);
        ppfVar5[local_34] = pfVar4;
      }
      if (in_EDI == 2) {
        puVar1 = Imf_2_5::Array2D<unsigned_int>::operator[](in_RSI,(long)local_30);
        uVar2 = SUB168(ZEXT416(puVar1[local_34]) * ZEXT816(2),0);
        if (SUB168(ZEXT416(puVar1[local_34]) * ZEXT816(2),8) != 0) {
          uVar2 = 0xffffffffffffffff;
        }
        phVar6 = (half *)operator_new__(uVar2);
        pphVar7 = Imf_2_5::Array2D<half_*>::operator[](in_R8,(long)local_30);
        pphVar7[local_34] = phVar6;
      }
    }
  }
  return;
}

Assistant:

void
allocatePixels (int type,
                Array2D<unsigned int>& sampleCount,
                Array2D<unsigned int*>& uintData,
                Array2D<float*>& floatData,
                Array2D<half*>& halfData,
                int x1, int x2, int y1, int y2)
{
    for (int y = y1; y <= y2; y++)
    {
        for (int x = x1; x <= x2; x++)
        {
            if (type == 0)
                uintData[y][x] = new unsigned int[sampleCount[y][x]];
            if (type == 1)
                floatData[y][x] = new float[sampleCount[y][x]];
            if (type == 2)
                halfData[y][x] = new half[sampleCount[y][x]];
        }
    }
}